

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::UseExpr::toString_abi_cxx11_(string *__return_storage_ptr__,UseExpr *this)

{
  bool bVar1;
  reference this_00;
  pointer pEVar2;
  string local_58 [32];
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_38;
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_28;
  const_iterator it;
  UseExpr *this_local;
  string *result;
  
  it._M_current._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"use ",(allocator<char> *)((long)&it._M_current + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 6));
  local_28._M_current =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
       std::
       vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ::begin(&this->exprs);
  while( true ) {
    local_30._M_current =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::end(&this->exprs);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38._M_current =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::begin(&this->exprs);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              ::operator*(&local_28);
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                       (this_00);
    (*pEVar2->_vptr_Expr[2])();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
    ::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UseExpr::toString() const noexcept {
  std::string result = "use ";
  for (auto it = exprs.begin(); it != exprs.end(); ++it) {
    if (it != exprs.begin())
      result += ", ";
      
    result += (*it)->toString();
  }

  return result;
}